

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O2

MatchResult __thiscall
r_exec::HLPController::check_predicted_evidences(HLPController *this,_Fact *target,_Fact **evidence)

{
  pointer pcVar1;
  byte bVar2;
  MatchResult MVar3;
  ulong uVar4;
  _iterator _Var5;
  _Fact *p_Var6;
  list<r_exec::HLPController::PEEntry> *this_00;
  float fVar7;
  const_iterator cVar8;
  const_iterator local_58;
  float local_44;
  pthread_mutex_t *local_40;
  _Fact **local_38;
  
  local_40 = (pthread_mutex_t *)&this->predicted_evidences;
  local_38 = evidence;
  std::mutex::lock((mutex *)&local_40->__data);
  uVar4 = (*Now)();
  this_00 = &(this->predicted_evidences).evidences;
  cVar8._list = this_00;
  cVar8.super__iterator._cell = (this->predicted_evidences).evidences.used_cells_head;
  local_58._list = this_00;
LAB_00188457:
  do {
    _Var5 = cVar8.super__iterator._cell;
    local_58.super__iterator._cell = _Var5._cell;
    if (_Var5._cell == -1) {
      MVar3 = MATCH_FAILURE;
      p_Var6 = (_Fact *)0x0;
LAB_00188506:
      *local_38 = p_Var6;
      pthread_mutex_unlock(local_40);
      return MVar3;
    }
    pcVar1 = ((cVar8._list)->cells).
             super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = (**(code **)(**(long **)&pcVar1[_Var5._cell].data.super_EEntry + 0x70))();
    if ((bVar2 | *(uint64_t *)((long)&pcVar1[_Var5._cell].data.super_EEntry + 0x10) < uVar4) == 1) {
      cVar8 = r_code::list<r_exec::HLPController::PEEntry>::erase(this_00,&local_58);
      local_58._list = cVar8._list;
      goto LAB_00188457;
    }
    MVar3 = _Fact::is_evidence(*(_Fact **)
                                &((local_58._list)->cells).
                                 super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                                 ._M_impl.super__Vector_impl_data._M_start
                                 [local_58.super__iterator._cell].data.super_EEntry,target);
    if (MVar3 != MATCH_FAILURE) {
      local_44 = _Fact::get_cfd(target);
      fVar7 = _Fact::get_cfd(*(_Fact **)
                              &((local_58._list)->cells).
                               super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [local_58.super__iterator._cell].data.super_EEntry);
      if (local_44 < fVar7) {
        p_Var6 = *(_Fact **)
                  &((local_58._list)->cells).
                   super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_58.super__iterator._cell].data.
                   super_EEntry;
        goto LAB_00188506;
      }
    }
    cVar8._list = local_58._list;
    cVar8.super__iterator._cell =
         ((local_58._list)->cells).
         super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
         ._M_impl.super__Vector_impl_data._M_start[local_58.super__iterator._cell].next;
  } while( true );
}

Assistant:

MatchResult HLPController::check_predicted_evidences(_Fact *target, _Fact *&evidence)
{
    MatchResult r = MATCH_FAILURE;
    std::lock_guard<std::mutex> guard(predicted_evidences.mutex);
    uint64_t now = Now();
    r_code::list<PEEntry>::const_iterator e;

    for (e = predicted_evidences.evidences.begin(); e != predicted_evidences.evidences.end();) {
        if ((*e).is_too_old(now)) { // garbage collection. // garbage collection.
            e = predicted_evidences.evidences.erase(e);
        } else {
            if ((r = (*e).evidence->is_evidence(target)) != MATCH_FAILURE) {
                if (target->get_cfd() < (*e).evidence->get_cfd()) {
                    evidence = (*e).evidence;
                    return r;
                } else {
                    r = MATCH_FAILURE;
                }
            }

            ++e;
        }
    }

    evidence = nullptr;
    return r;
}